

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O1

ma_uint64 ma_dr_wav_read_pcm_frames_le(ma_dr_wav *pWav,ma_uint64 framesToRead,void *pBufferOut)

{
  ushort uVar1;
  uint uVar2;
  ma_uint64 mVar3;
  uint uVar4;
  ulong uVar5;
  size_t sVar6;
  
  if (framesToRead != 0 && pWav != (ma_dr_wav *)0x0) {
    uVar1 = pWav->translatedFormatTag;
    if ((uVar1 == 2) || (uVar1 == 0x11)) {
      return 0;
    }
    uVar5 = pWav->totalPCMFrameCount - pWav->readCursorInPCMFrames;
    if (framesToRead <= uVar5) {
      uVar5 = framesToRead;
    }
    if ((pWav->bitsPerSample & 7) == 0) {
      uVar2 = (uint)(pWav->fmt).channels * (uint)pWav->bitsPerSample >> 3;
    }
    else {
      uVar2 = (uint)(pWav->fmt).blockAlign;
    }
    if (((uVar1 & 0xfffe) != 6) || (uVar4 = 0, uVar2 == (pWav->fmt).channels)) {
      uVar4 = uVar2;
    }
    if (uVar4 != 0) {
      sVar6 = uVar5 * uVar4;
      if (sVar6 == 0) {
        mVar3 = 0;
      }
      else {
        sVar6 = ma_dr_wav_read_raw(pWav,sVar6,pBufferOut);
        mVar3 = sVar6 / uVar4;
      }
      return mVar3;
    }
  }
  return 0;
}

Assistant:

MA_API ma_uint64 ma_dr_wav_read_pcm_frames_le(ma_dr_wav* pWav, ma_uint64 framesToRead, void* pBufferOut)
{
    ma_uint32 bytesPerFrame;
    ma_uint64 bytesToRead;
    ma_uint64 framesRemainingInFile;
    if (pWav == NULL || framesToRead == 0) {
        return 0;
    }
    if (ma_dr_wav__is_compressed_format_tag(pWav->translatedFormatTag)) {
        return 0;
    }
    framesRemainingInFile = pWav->totalPCMFrameCount - pWav->readCursorInPCMFrames;
    if (framesToRead > framesRemainingInFile) {
        framesToRead = framesRemainingInFile;
    }
    bytesPerFrame = ma_dr_wav_get_bytes_per_pcm_frame(pWav);
    if (bytesPerFrame == 0) {
        return 0;
    }
    bytesToRead = framesToRead * bytesPerFrame;
    if (bytesToRead > MA_SIZE_MAX) {
        bytesToRead = (MA_SIZE_MAX / bytesPerFrame) * bytesPerFrame;
    }
    if (bytesToRead == 0) {
        return 0;
    }
    return ma_dr_wav_read_raw(pWav, (size_t)bytesToRead, pBufferOut) / bytesPerFrame;
}